

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O3

TrapezoidList * __thiscall
gepard::TrapezoidTessellator::trapezoidList_abi_cxx11_
          (TrapezoidList *__return_storage_ptr__,TrapezoidTessellator *this,GepardState *state)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  FloatPoint *pFVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  Float FVar7;
  bool bVar8;
  TrapezoidTessellator *pTVar9;
  bool bVar10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  long lVar13;
  uint uVar14;
  Transform *this_00;
  Trapezoid *pTVar15;
  _List_node_base *p_Var16;
  _Node *__tmp;
  uint uVar17;
  iterator __end2;
  bool bVar18;
  ArcElement *ae;
  ArcElement *arcElement;
  FloatPoint *pFVar19;
  byte bVar20;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 uVar22;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 auVar23 [16];
  double dVar27;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  FloatPoint FVar28;
  TrapezoidList trapezoids;
  FloatPoint to;
  FloatPoint from;
  FloatPoint lastMoveTo;
  SegmentApproximator segmentApproximator;
  Transform at;
  FloatPoint local_1c0;
  long local_1b0;
  FloatPoint FStack_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [24];
  TrapezoidTessellator *local_170;
  undefined1 local_168 [16];
  FloatPoint local_158;
  FloatPoint local_148;
  FloatPoint local_138;
  FloatPoint local_128;
  _List_node_base *local_118;
  double local_110;
  _List_node_base *local_108;
  double local_100;
  undefined1 local_f8 [16];
  FloatPoint local_e8;
  double local_d8;
  undefined8 uStack_d0;
  SegmentApproximator local_c8;
  Transform local_68;
  
  bVar20 = 0;
  arcElement = (ArcElement *)this->_pathData->_firstElement;
  if ((arcElement == (ArcElement *)0x0) ||
     ((arcElement->super_PathElement).next == (PathElement *)0x0)) {
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node._M_size = 0;
  }
  else {
    local_170 = this;
    if ((arcElement->super_PathElement).type != MoveTo) {
      __assert_fail("element->type == PathElementTypes::MoveTo",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                    ,0x283,
                    "const TrapezoidList gepard::TrapezoidTessellator::trapezoidList(const GepardState &)"
                   );
    }
    SegmentApproximator::SegmentApproximator(&local_c8,this->_antiAliasingLevel,1.0);
    FloatPoint::FloatPoint(&local_148);
    local_158.x = (arcElement->super_PathElement).to.x;
    local_158.y = (arcElement->super_PathElement).to.y;
    local_138.x = (arcElement->super_PathElement).to.x;
    local_138.y = (arcElement->super_PathElement).to.y;
    local_68.data[0] = (state->transform).data[0];
    local_68.data[1] = (state->transform).data[1];
    local_68.data[2] = (state->transform).data[2];
    local_68.data[3] = (state->transform).data[3];
    local_68.data[4] = (state->transform).data[4];
    local_68.data[5] = (state->transform).data[5];
    this_00 = &local_68;
    do {
      local_148.x = local_158.x;
      local_148.y = local_158.y;
      arcElement = (ArcElement *)(arcElement->super_PathElement).next;
      local_158.x = (arcElement->super_PathElement).to.x;
      local_158.y = (arcElement->super_PathElement).to.y;
      switch((arcElement->super_PathElement).type) {
      case MoveTo:
        FVar28 = Transform::apply(this_00,&local_148);
        local_1c0.y = FVar28.y;
        local_1c0.x = FVar28.x;
        FVar28 = Transform::apply(this_00,&local_138);
        FStack_1a8.y = FVar28.y;
        FStack_1a8.x = FVar28.x;
        SegmentApproximator::insertLine(&local_c8,&local_1c0,&FStack_1a8);
        goto LAB_00112e8a;
      case LineTo:
        FVar28 = Transform::apply(this_00,&local_148);
        local_1c0.y = FVar28.y;
        local_1c0.x = FVar28.x;
        FVar28 = Transform::apply(this_00,&local_158);
        FStack_1a8.y = FVar28.y;
        FStack_1a8.x = FVar28.x;
        SegmentApproximator::insertLine(&local_c8,&local_1c0,&FStack_1a8);
        break;
      case QuadraticCurve:
        FVar28 = Transform::apply(this_00,&local_148);
        local_1c0.y = FVar28.y;
        local_1c0.x = FVar28.x;
        FVar28 = Transform::apply(this_00,&arcElement->center);
        FStack_1a8.y = FVar28.y;
        FStack_1a8.x = FVar28.x;
        FVar28 = Transform::apply(this_00,&local_158);
        local_128.y = FVar28.y;
        local_128.x = FVar28.x;
        SegmentApproximator::insertQuadCurve(&local_c8,&local_1c0,&FStack_1a8,&local_128);
        break;
      case BezierCurve:
        FVar28 = Transform::apply(this_00,&local_148);
        local_1c0.y = FVar28.y;
        local_1c0.x = FVar28.x;
        FVar28 = Transform::apply(this_00,&arcElement->center);
        FStack_1a8.y = FVar28.y;
        FStack_1a8.x = FVar28.x;
        FVar28 = Transform::apply(this_00,&arcElement->radius);
        local_128.y = FVar28.y;
        local_128.x = FVar28.x;
        FVar28 = Transform::apply(this_00,&local_158);
        local_e8.y = FVar28.y;
        local_e8.x = FVar28.x;
        SegmentApproximator::insertBezierCurve
                  (&local_c8,&local_1c0,&FStack_1a8,&local_128,&local_e8);
        break;
      case Arc:
        FVar28 = Transform::apply(this_00,&local_148);
        local_1c0.y = FVar28.y;
        local_1c0.x = FVar28.x;
        SegmentApproximator::insertArc(&local_c8,&local_1c0,arcElement,this_00);
        break;
      case CloseSubpath:
        FVar28 = Transform::apply(this_00,&local_148);
        local_1c0.y = FVar28.y;
        local_1c0.x = FVar28.x;
        FVar28 = Transform::apply(this_00,&local_138);
        FStack_1a8.y = FVar28.y;
        FStack_1a8.x = FVar28.x;
        SegmentApproximator::insertLine(&local_c8,&local_1c0,&FStack_1a8);
LAB_00112e8a:
        local_138.x = local_158.x;
        local_138.y = local_158.y;
      }
    } while ((arcElement->super_PathElement).next != (PathElement *)0x0);
    FVar28 = Transform::apply(&local_68,&(arcElement->super_PathElement).to);
    local_1c0.y = FVar28.y;
    local_1c0.x = FVar28.x;
    FVar28 = Transform::apply(&local_68,&local_138);
    FStack_1a8.y = FVar28.y;
    FStack_1a8.x = FVar28.x;
    SegmentApproximator::insertLine(&local_c8,&local_1c0,&FStack_1a8);
    p_Var11 = (_List_node_base *)SegmentApproximator::segments_abi_cxx11_(&local_c8);
    local_1b0 = 0;
    p_Var16 = p_Var11->_M_next;
    local_1c0.x = (Float)&local_1c0;
    local_1c0.y = (Float)&local_1c0;
    if (p_Var16 != p_Var11) {
      local_d8 = (double)local_170->_antiAliasingLevel;
      uStack_d0 = 0;
      local_f8._8_4_ = SUB84(local_d8,0);
      local_f8._0_8_ = local_d8;
      local_f8._12_4_ = (int)((ulong)local_d8 >> 0x20);
      bVar10 = false;
      uVar17 = 0;
      do {
        p_Var2 = p_Var16[1]._M_prev;
        p_Var12 = p_Var16[2]._M_prev;
        if (((double)p_Var2 != (double)p_Var12) || (NAN((double)p_Var2) || NAN((double)p_Var12))) {
          uVar14 = uVar17 + *(int *)&p_Var16[4]._M_next;
          uVar17 = (uint)(uVar17 == 0);
          if (local_170->_fillRule != EvenOdd) {
            uVar17 = uVar14;
          }
          if (uVar17 == 0) {
            local_100 = floor((double)p_Var16[1]._M_next * 1125899906842624.0);
            dVar27 = floor((double)p_Var16[2]._M_next * 1125899906842624.0);
            if (((double)local_198._0_8_ != (double)local_168._0_8_) ||
               (NAN((double)local_198._0_8_) || NAN((double)local_168._0_8_))) {
              p_Var2 = p_Var16[3]._M_next;
              local_118 = p_Var16[3]._M_prev;
              local_110 = dVar27;
              p_Var12 = (_List_node_base *)operator_new(0x58);
              p_Var12[1]._M_next = (_List_node_base *)local_198._0_8_;
              p_Var12[1]._M_prev = (_List_node_base *)local_188._8_8_;
              p_Var12[2]._M_next =
                   (_List_node_base *)((local_100 * 8.881784197001252e-16) / local_d8);
              p_Var12[2]._M_prev = (_List_node_base *)local_168._0_8_;
              p_Var12[3]._M_next = (_List_node_base *)local_188._0_8_;
              p_Var12[3]._M_prev =
                   (_List_node_base *)((local_110 * 8.881784197001252e-16) / local_d8);
              *(int *)&p_Var12[4]._M_next = (int)this_00;
              *(int *)((long)&p_Var12[4]._M_next + 4) = (int)(long)(double)p_Var2;
              p_Var12[4]._M_prev = local_108;
              p_Var12[5]._M_next = local_118;
              std::__detail::_List_node_base::_M_hook(p_Var12);
              local_1b0 = local_1b0 + 1;
            }
            uVar17 = 0;
LAB_001131c9:
            bVar10 = false;
          }
          else {
            bVar18 = true;
            bVar8 = !bVar10;
            bVar10 = bVar18;
            if (bVar8) {
              local_188._0_8_ = p_Var2;
              dVar27 = floor((double)p_Var12);
              local_198._8_4_ = extraout_XMM0_Dc;
              local_198._0_8_ = dVar27;
              local_198._12_4_ = extraout_XMM0_Dd;
              dVar27 = floor((double)local_188._0_8_);
              auVar25._0_8_ = (double)(int)dVar27;
              auVar25._8_8_ = (double)(int)(double)local_198._0_8_;
              auVar25 = divpd(auVar25,local_f8);
              local_188._0_8_ = auVar25._0_8_ * 1125899906842624.0;
              local_188._8_8_ = auVar25._8_8_ * 1125899906842624.0;
              dVar27 = floor((double)local_188._0_8_);
              local_198._8_4_ = extraout_XMM0_Dc_00;
              local_198._0_8_ = dVar27;
              local_198._12_4_ = extraout_XMM0_Dd_00;
              dVar27 = floor((double)local_188._8_8_);
              local_198._8_8_ = dVar27 * 8.881784197001252e-16;
              local_198._0_8_ = (double)local_198._0_8_ * 8.881784197001252e-16;
              dVar27 = (double)p_Var16[2]._M_next * 1125899906842624.0;
              dVar6 = (double)p_Var16[1]._M_next * 1125899906842624.0;
              local_168._8_4_ = SUB84(dVar6,0);
              local_168._0_8_ = dVar27;
              local_168._12_4_ = (int)((ulong)dVar6 >> 0x20);
              dVar27 = floor(dVar27);
              local_188._8_4_ = extraout_XMM0_Dc_01;
              local_188._0_8_ = dVar27;
              local_188._12_4_ = extraout_XMM0_Dd_01;
              dVar27 = floor((double)local_168._8_8_);
              auVar23._0_8_ = (double)local_188._0_8_ * 8.881784197001252e-16;
              auVar23._8_8_ = dVar27 * 8.881784197001252e-16;
              local_188._0_16_ = divpd(auVar23,local_f8);
              this_00 = (Transform *)(long)(double)p_Var16[3]._M_next;
              local_108 = p_Var16[3]._M_prev;
              dVar27 = local_198._8_8_;
              local_168._8_4_ = local_198._8_4_;
              local_168._0_8_ = dVar27;
              local_168._12_4_ = local_198._12_4_;
              if ((local_198._0_8_ == dVar27) && (!NAN(local_198._0_8_) && !NAN(dVar27)))
              goto LAB_001131c9;
            }
          }
        }
        p_Var16 = (((_List_base<gepard::Segment,_std::allocator<gepard::Segment>_> *)
                   &p_Var16->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var16 != p_Var11);
      p_Var16 = p_Var11->_M_next;
    }
    while (p_Var16 != p_Var11) {
      p_Var2 = p_Var16->_M_next;
      operator_delete(p_Var16);
      p_Var16 = p_Var2;
    }
    operator_delete(p_Var11);
    pTVar9 = local_170;
    local_198._8_8_ = 0;
    local_198._0_8_ = (double)local_170->_antiAliasingLevel;
    local_168._8_4_ = SUB84(local_c8._boundingBox.minY * 1125899906842624.0,0);
    local_168._0_8_ = local_c8._boundingBox.minX * 1125899906842624.0;
    local_168._12_4_ = (int)((ulong)(local_c8._boundingBox.minY * 1125899906842624.0) >> 0x20);
    dVar27 = floor(local_c8._boundingBox.minX * 1125899906842624.0);
    local_188._8_4_ = extraout_XMM0_Dc_02;
    local_188._0_8_ = dVar27;
    local_188._12_4_ = extraout_XMM0_Dd_02;
    dVar27 = floor((double)local_168._8_8_);
    auVar24._0_8_ = (double)local_188._0_8_ * 8.881784197001252e-16;
    auVar24._8_8_ = dVar27 * 8.881784197001252e-16;
    uVar21 = local_198._0_4_;
    uVar22 = local_198._4_4_;
    uVar4 = local_198._0_8_;
    local_198._8_4_ = uVar21;
    local_198._0_8_ = uVar4;
    local_198._12_4_ = uVar22;
    auVar5._8_4_ = uVar21;
    auVar5._0_8_ = uVar4;
    auVar5._12_4_ = uVar22;
    auVar25 = divpd(auVar24,auVar5);
    (pTVar9->_boundingBox).minX = (Float)auVar25._0_8_;
    (pTVar9->_boundingBox).minY = (Float)auVar25._8_8_;
    local_168._8_4_ = SUB84(local_c8._boundingBox.maxY * 1125899906842624.0,0);
    local_168._0_8_ = local_c8._boundingBox.maxX * 1125899906842624.0;
    local_168._12_4_ = (int)((ulong)(local_c8._boundingBox.maxY * 1125899906842624.0) >> 0x20);
    dVar27 = floor(local_c8._boundingBox.maxX * 1125899906842624.0);
    local_188._8_4_ = extraout_XMM0_Dc_03;
    local_188._0_8_ = dVar27;
    local_188._12_4_ = extraout_XMM0_Dd_03;
    dVar27 = floor((double)local_168._8_8_);
    auVar26._0_8_ = (double)local_188._0_8_ * 8.881784197001252e-16;
    auVar26._8_8_ = dVar27 * 8.881784197001252e-16;
    auVar25 = divpd(auVar26,local_198);
    (pTVar9->_boundingBox).maxX = (Float)auVar25._0_8_;
    (pTVar9->_boundingBox).maxY = (Float)auVar25._8_8_;
    std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::sort
              ((list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&local_1c0);
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
    (__return_storage_ptr__->super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
    )._M_impl._M_node._M_size = 0;
    for (pFVar3 = (FloatPoint *)local_1c0.x; pFVar19 = (FloatPoint *)local_1c0.x,
        pFVar3 != &local_1c0; pFVar3 = (FloatPoint *)pFVar3->x) {
      if ((*(int *)&pFVar3[4].x == 0) || (*(int *)((long)&pFVar3[4].x + 4) == 0)) {
        __assert_fail("current->leftId != 0 && current->rightId != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                      ,0x2fa,
                      "const TrapezoidList gepard::TrapezoidTessellator::trapezoidList(const GepardState &)"
                     );
      }
      if (pFVar3 == &local_1c0) {
LAB_0011336f:
        p_Var11 = (_List_node_base *)operator_new(0x58);
        pTVar15 = (Trapezoid *)(pFVar3 + 1);
        p_Var16 = p_Var11 + 1;
        for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
          p_Var16->_M_next = (_List_node_base *)pTVar15->topY;
          pTVar15 = (Trapezoid *)((long)pTVar15 + (ulong)bVar20 * -0x10 + 8);
          p_Var16 = (_List_node_base *)&p_Var16[-(ulong)bVar20]._M_prev;
        }
        std::__detail::_List_node_base::_M_hook(p_Var11);
        psVar1 = &(__return_storage_ptr__->
                  super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>)._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        local_198._0_8_ = pFVar3[2].y;
        pFVar19 = pFVar3;
        do {
          dVar27 = pFVar19[1].x;
          if ((double)local_198._0_8_ < dVar27) break;
          if ((*(int *)&pFVar19[4].x == 0) || (*(int *)((long)&pFVar19[4].x + 4) == 0)) {
            __assert_fail("further->leftId != 0 && further->rightId != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                          ,0x2fd,
                          "const TrapezoidList gepard::TrapezoidTessellator::trapezoidList(const GepardState &)"
                         );
          }
          if (((dVar27 == pFVar3[2].y) && (!NAN(dVar27) && !NAN(pFVar3[2].y))) &&
             (bVar10 = Trapezoid::isMergableInTo
                                 ((Trapezoid *)(pFVar3 + 1),(Trapezoid *)(pFVar19 + 1)), bVar10)) {
            FVar7 = pFVar3[1].y;
            pFVar19[1].x = pFVar3[1].x;
            pFVar19[1].y = FVar7;
            pFVar19[2].x = pFVar3[2].x;
            pFVar3[4].x = 0.0;
            goto LAB_0011339a;
          }
          pFVar19 = (FloatPoint *)pFVar19->x;
        } while (pFVar19 != &local_1c0);
        if (*(int *)&pFVar3[4].x != 0) goto LAB_0011336f;
      }
LAB_0011339a:
    }
    while (pFVar19 != &local_1c0) {
      pFVar3 = (FloatPoint *)pFVar19->x;
      operator_delete(pFVar19);
      pFVar19 = pFVar3;
    }
    SegmentApproximator::~SegmentApproximator(&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

const TrapezoidList TrapezoidTessellator::trapezoidList(const GepardState& state)
{
    PathElement* element = _pathData.firstElement();

    if (!element || !element->next)
        return TrapezoidList();

    GD_ASSERT(element->type == PathElementTypes::MoveTo);

    const Float subPixelPrecision = 1.0;
    SegmentApproximator segmentApproximator(_antiAliasingLevel, subPixelPrecision);
    FloatPoint from;
    FloatPoint to = element->to;
    FloatPoint lastMoveTo = to;
    Transform at = state.transform;

    // 1. Insert path elements.
    do {
        from = to;
        element = element->next;
        to = element->to;
        switch (element->type) {
        case PathElementTypes::MoveTo: {
            segmentApproximator.insertLine(at.apply(from), at.apply(lastMoveTo));
            lastMoveTo = to;
            break;
        }
        case PathElementTypes::LineTo: {
            segmentApproximator.insertLine(at.apply(from), at.apply(to));
            break;
        }
        case PathElementTypes::CloseSubpath: {
            segmentApproximator.insertLine(at.apply(from), at.apply(lastMoveTo));
            lastMoveTo = to;
            break;
        }
        case PathElementTypes::QuadraticCurve: {
            QuadraticCurveToElement* qe = reinterpret_cast<QuadraticCurveToElement*>(element);
            segmentApproximator.insertQuadCurve(at.apply(from), at.apply(qe->control), at.apply(to));
            break;
        }
        case PathElementTypes::BezierCurve: {
            BezierCurveToElement* be = reinterpret_cast<BezierCurveToElement*>(element);
            segmentApproximator.insertBezierCurve(at.apply(from), at.apply(be->control1), at.apply(be->control2), at.apply(to));
            break;
        }
        case PathElementTypes::Arc: {
            ArcElement* ae = reinterpret_cast<ArcElement*>(element);
            segmentApproximator.insertArc(at.apply(from), ae, at);
            break;
        }
        case PathElementTypes::Undefined:
        default:
            // unreachable
            break;
        }
    } while (element->next != nullptr);

    segmentApproximator.insertLine(at.apply(element->to), at.apply(lastMoveTo));

    // 2. Use approximator to generate the list of segments.
    SegmentList* segmentList = segmentApproximator.segments();
    TrapezoidList trapezoids;

    // 3. Generate trapezoids.
    const Float denom = _antiAliasingLevel * 1 + 0;
    if (segmentList) {
        Trapezoid trapezoid;
        int fill = 0;
        bool isInFill = false;
        for (Segment& segment : *segmentList) {
            if (segment.from.y == segment.to.y)
                continue;
            if (fillRule() == EvenOdd) {
                fill = !fill;
            } else {
                fill += segment.direction;
            }

            if (fill) {
                if (!isInFill) {
                    trapezoid.topY = (fixPrecision(segment.topY() / denom));
                    trapezoid.bottomY = (fixPrecision(segment.bottomY() / denom));
                    trapezoid.topLeftX = (fixPrecision(segment.from.x) / denom);
                    trapezoid.bottomLeftX = (fixPrecision(segment.to.x) / denom);
                    trapezoid.leftId = segment.id;
                    trapezoid.leftSlope = segment.realSlope;
                    if (trapezoid.topY != trapezoid.bottomY)
                        isInFill = true;
                }
            } else {
                // TODO: Horizontal merge trapezoids.
                trapezoid.topRightX = (fixPrecision(segment.from.x) / denom);
                trapezoid.bottomRightX = (fixPrecision(segment.to.x) / denom);
                trapezoid.rightId = segment.id;
                trapezoid.rightSlope = segment.realSlope;
                if (trapezoid.topY != trapezoid.bottomY) {
                    trapezoids.push_back(trapezoid);
                }
                isInFill = false;
            }
            //! \todo(szledan): we need this assert in the future,
            //! but the TT doesn't work correctly now with that.
            // GD_ASSERT(trapezoid.topY == (fixPrecision(segment.topY() / denom)));
        }

        delete segmentList;

        //! \todo(szledan): check the boundingBox calculation:
        // NOTE:  maxX = (maxX + (_antiAliasingLevel - 1)) / _antiAliasingLevel;
        _boundingBox.minX = (fixPrecision(segmentApproximator.boundingBox().minX) / _antiAliasingLevel);
        _boundingBox.minY = (fixPrecision(segmentApproximator.boundingBox().minY) / _antiAliasingLevel);
        _boundingBox.maxX = (fixPrecision(segmentApproximator.boundingBox().maxX) / _antiAliasingLevel);
        _boundingBox.maxY = (fixPrecision(segmentApproximator.boundingBox().maxY) / _antiAliasingLevel);
    }

    trapezoids.sort();

    // 4. Vertical merge trapezoids.
    //! \todo(szledan): use MovePtr:
    TrapezoidList trapezoidList;
    for (TrapezoidList::iterator current = trapezoids.begin(); current != trapezoids.end(); ++current) {
        const Float bottomY = current->bottomY;
        TrapezoidList::iterator ft = current;
        for (; (ft != trapezoids.end() && ft->bottomY == bottomY); ++ft);

        GD_ASSERT(current->leftId != 0 && current->rightId != 0);
        GD_ASSERT(current->leftSlope != NAN && current->rightSlope != NAN);
        for (TrapezoidList::iterator further = current; (further != trapezoids.end() && further->topY <= bottomY); ++further) {
            GD_ASSERT(further->leftId != 0 && further->rightId != 0);
            GD_ASSERT(further->leftSlope != NAN && further->rightSlope != NAN);
            if (further->topY == current->bottomY && current->isMergableInTo(&*further)) {
                further->topY = current->topY;
                further->topLeftX = current->topLeftX;
                further->topRightX = current->topRightX;
                current->leftId = 0;
                current->rightId = 0;
                break;
            }
        }
        if (current->leftId) {
            trapezoidList.push_back(*current);
        }
    }

    return trapezoidList;
}